

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pFVar3;
  size_t sVar4;
  pointer pTVar5;
  pointer pMVar6;
  pointer pGVar7;
  pointer pEVar8;
  pointer pEVar9;
  Func *pFVar10;
  ElemSegment *pEVar11;
  ElemDesc *pEVar12;
  pointer pDVar13;
  DataDesc *pDVar14;
  pointer pSVar15;
  Instance *pIVar16;
  int iVar17;
  Result RVar18;
  Ref *pRVar19;
  Func *pFVar20;
  Module *extraout_RAX;
  Module *pMVar21;
  ulong uVar22;
  pointer pRVar23;
  pointer pRVar24;
  pointer pEVar25;
  ElemSegment *src;
  FuncDesc *desc;
  pointer pFVar26;
  pointer pTVar27;
  pointer pMVar28;
  pointer pGVar29;
  ulong uVar30;
  Ptr *pPVar31;
  iterator iVar32;
  Store *store_00;
  Index index;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  undefined8 uVar33;
  ulong uVar34;
  ulong uVar35;
  ElemDesc *desc_5;
  long lVar36;
  long lVar37;
  pointer pSVar38;
  ExportDesc *desc_4;
  pointer pEVar39;
  pointer pDVar40;
  Value VVar41;
  Ref ref;
  Values results;
  Ref extern_ref;
  undefined1 local_1f8 [32];
  Value local_1d8;
  Index local_1c8;
  RefPtr<wabt::interp::Instance> local_1b8;
  Ptr *local_1a0;
  Ptr *local_198;
  RefVec *local_190;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_188;
  RefPtr<wabt::interp::Module> local_168;
  Store *local_150;
  RefPtr<wabt::interp::Trap> local_148;
  long local_130;
  GlobalType local_128;
  EventType local_110;
  Ref local_e8;
  FuncDesc local_e0;
  MemoryType local_80;
  TableType local_58;
  
  local_1a0 = __return_storage_ptr__;
  local_e8.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_168,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_1b8,store,store,&local_e8);
  pIVar1 = ((local_168.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ((local_168.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar34 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_190 = imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar34) {
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"not enough imports!","");
    local_148.root_index_ = 0;
    local_148.obj_ = (Trap *)0x0;
    local_148.store_ = (Store *)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              ((RefPtr<wabt::interp::Trap> *)&local_1d8.v128_,store,store,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
               (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148);
    out_trap->obj_ = (Trap *)local_1d8.i64_;
    out_trap->store_ = (Store *)local_1d8._8_8_;
    out_trap->root_index_ = local_1c8;
    local_1c8 = 0;
    local_1d8 = (Value)ZEXT816(0);
    if (local_148.obj_ != (Trap *)0x0) {
      operator_delete(local_148.obj_);
    }
LAB_00151e13:
    if ((Func *)local_1f8._0_8_ != (Func *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    local_1a0->obj_ = (Instance *)0x0;
    local_1a0->store_ = (Store *)0x0;
    local_1a0->root_index_ = 0;
LAB_00152cce:
    if (local_1b8.obj_ != (Instance *)0x0) {
      FreeList<wabt::interp::Ref>::Delete(&(local_1b8.store_)->roots_,local_1b8.root_index_);
    }
  }
  else {
    local_198 = out_trap;
    if (pIVar2 != pIVar1) {
      local_130 = uVar34 + (uVar34 == 0);
      lVar37 = 0;
      lVar36 = 0;
      do {
        pPVar31 = local_198;
        pIVar1 = ((local_168.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_190->
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar36].index;
        if (local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "invalid import \"%s.%s\"",
                     *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus + lVar37),
                     *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus + lVar37));
          local_148.root_index_ = 0;
          local_148.obj_ = (Trap *)0x0;
          local_148.store_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_1d8.v128_,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_148
                    );
          pPVar31->obj_ = (Trap *)local_1d8.i64_;
          pPVar31->store_ = (Store *)local_1d8._8_8_;
          pPVar31->root_index_ = local_1c8;
          local_1c8 = 0;
          local_1d8 = (Value)ZEXT816(0);
          if (local_148.obj_ != (Trap *)0x0) {
            operator_delete(local_148.obj_);
          }
          goto LAB_00151e13;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)local_1f8,store,
                   (Ref)local_188.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar17 = (**(code **)(*(long *)local_1f8._0_8_ + 0x18))
                           (local_1f8._0_8_,store,(long)&(pIVar1->type).module._M_dataplus + lVar37,
                            pPVar31);
        if (iVar17 == 1) {
          local_1a0->obj_ = (Instance *)0x0;
          local_1a0->store_ = (Store *)0x0;
          local_1a0->root_index_ = 0;
        }
        else {
          iVar32._M_current =
               ((local_1b8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar32._M_current ==
              ((local_1b8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_1b8.obj_)->imports_,iVar32,(Ref *)&local_188);
          }
          else {
            (iVar32._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1b8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)((long)&(pIVar1->type).type._M_t + lVar37) + 8)) {
          case 0:
            iVar32._M_current =
                 ((local_1b8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1b8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->funcs_;
LAB_00152034:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar32,(Ref *)&local_188);
            }
            else {
              (iVar32._M_current)->index =
                   (size_t)local_188.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_1b8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            }
            break;
          case 1:
            iVar32._M_current =
                 ((local_1b8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1b8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->tables_;
              goto LAB_00152034;
            }
            (iVar32._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1b8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 2:
            iVar32._M_current =
                 ((local_1b8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1b8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->memories_;
              goto LAB_00152034;
            }
            (iVar32._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1b8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 3:
            iVar32._M_current =
                 ((local_1b8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1b8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->globals_;
              goto LAB_00152034;
            }
            (iVar32._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1b8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 4:
            iVar32._M_current =
                 ((local_1b8.obj_)->events_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1b8.obj_)->events_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->events_;
              goto LAB_00152034;
            }
            (iVar32._M_current)->index =
                 (size_t)local_188.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1b8.obj_)->events_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
          }
        }
        if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_)
          ;
        }
        if (iVar17 == 1) goto LAB_00152cce;
        lVar36 = lVar36 + 1;
        lVar37 = lVar37 + 0x48;
      } while (local_130 != lVar36);
    }
    pFVar3 = ((local_168.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar16 = local_1b8.obj_;
    for (pFVar26 = ((local_168.obj_)->desc_).funcs.
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar26 != pFVar3;
        pFVar26 = pFVar26 + 1) {
      pRVar19 = (Ref *)&Ref::Null;
      local_1b8.obj_ = pIVar16;
      if (local_1b8.store_ != (Store *)0x0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            (&(local_1b8.store_)->roots_,local_1b8.root_index_);
      }
      sVar4 = pRVar19->index;
      local_e0.type.super_ExternType.kind = (pFVar26->type).super_ExternType.kind;
      local_e0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001a01d0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_e0.type.params,&(pFVar26->type).params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_e0.type.results,&(pFVar26->type).results);
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                (&local_e0.locals,&pFVar26->locals);
      local_e0.code_offset = pFVar26->code_offset;
      local_1d8.i64_ = sVar4;
      Store::
      Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                ((RefPtr<wabt::interp::DefinedFunc> *)local_1f8,store,store,&local_1d8.ref_,
                 &local_e0);
      pRVar19 = (Ref *)&Ref::Null;
      if ((Store *)local_1f8._8_8_ != (Store *)0x0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      local_1d8.i64_ = pRVar19->index;
      iVar32._M_current =
           (pIVar16->funcs_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar16->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar16->funcs_,iVar32,&local_1d8.ref_);
      }
      else {
        (iVar32._M_current)->index = pRVar19->index;
        (pIVar16->funcs_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
        local_1f8._0_8_ = (Func *)0x0;
        local_1f8._8_8_ = (Store *)0x0;
        local_1f8._16_8_ = 0;
      }
      if (local_e0.locals.
          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.locals.
                        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_e0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001a01d0;
      if (local_e0.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.type.results.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.type.params.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar16 = local_1b8.obj_;
    }
    pTVar5 = ((local_168.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar27 = ((local_168.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar27 != pTVar5;
        pTVar27 = pTVar27 + 1) {
      local_58.super_ExternType.kind = (pTVar27->type).super_ExternType.kind;
      local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001a0210;
      local_58.limits._12_6_ =
           SUB86((ulong)*(undefined8 *)((long)&(pTVar27->type).limits.max + 2) >> 0x10,0);
      local_58._12_8_ = *(undefined8 *)&(pTVar27->type).super_ExternType.field_0xc;
      uVar33 = *(undefined8 *)((long)&(pTVar27->type).limits.initial + 4);
      local_58.limits._4_6_ = SUB86(uVar33,0);
      local_58.limits.max._2_2_ = (undefined2)((ulong)uVar33 >> 0x30);
      local_1b8.obj_ = pIVar16;
      Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                ((RefPtr<wabt::interp::Table> *)local_1f8,store,store,&local_58);
      pRVar19 = (Ref *)&Ref::Null;
      if ((Store *)local_1f8._8_8_ != (Store *)0x0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      local_1d8.i64_ = pRVar19->index;
      iVar32._M_current =
           (pIVar16->tables_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar16->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar16->tables_,iVar32,&local_1d8.ref_);
      }
      else {
        (iVar32._M_current)->index = pRVar19->index;
        (pIVar16->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      pIVar16 = local_1b8.obj_;
    }
    pMVar6 = ((local_168.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar28 = ((local_168.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1b8.obj_ = pIVar16,
        pMVar28 != pMVar6; pMVar28 = pMVar28 + 1) {
      local_80.super_ExternType.kind = (pMVar28->type).super_ExternType.kind;
      local_80.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001a0250;
      local_80.limits.has_max = (pMVar28->type).limits.has_max;
      local_80.limits.is_shared = (pMVar28->type).limits.is_shared;
      local_80.limits._18_6_ = *(undefined6 *)&(pMVar28->type).limits.field_0x12;
      local_80.limits.initial = (pMVar28->type).limits.initial;
      local_80.limits.max = (pMVar28->type).limits.max;
      Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                ((RefPtr<wabt::interp::Memory> *)local_1f8,store,store,&local_80);
      pRVar19 = (Ref *)&Ref::Null;
      if ((Store *)local_1f8._8_8_ != (Store *)0x0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      local_1d8.i64_ = pRVar19->index;
      iVar32._M_current =
           (pIVar16->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar16->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar16->memories_,iVar32,&local_1d8.ref_);
      }
      else {
        (iVar32._M_current)->index = pRVar19->index;
        (pIVar16->memories_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      pIVar16 = local_1b8.obj_;
    }
    pGVar29 = ((local_168.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar7 = ((local_168.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar29 != pGVar7) {
      do {
        pIVar16 = local_1b8.obj_;
        local_128.super_ExternType.kind = (pGVar29->type).super_ExternType.kind;
        local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001a0290;
        local_128._12_8_ = *(undefined8 *)&(pGVar29->type).super_ExternType.field_0xc;
        local_1d8 = ResolveInitExpr(local_1b8.obj_,store,pGVar29->init);
        Store::
        Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                  ((RefPtr<wabt::interp::Global> *)local_1f8,store,store,&local_128,&local_1d8);
        pRVar19 = (Ref *)&Ref::Null;
        if ((Store *)local_1f8._8_8_ != (Store *)0x0) {
          pRVar19 = FreeList<wabt::interp::Ref>::Get
                              ((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
        }
        local_1d8.i64_ = pRVar19->index;
        iVar32._M_current =
             (pIVar16->globals_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar32._M_current ==
            (pIVar16->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar16->globals_,iVar32,&local_1d8.ref_);
        }
        else {
          (iVar32._M_current)->index = pRVar19->index;
          (pIVar16->globals_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar32._M_current + 1;
        }
        if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_)
          ;
        }
        pGVar29 = pGVar29 + 1;
      } while (pGVar29 != pGVar7);
    }
    pEVar8 = ((local_168.obj_)->desc_).events.
             super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar16 = local_1b8.obj_;
    pPVar31 = local_198;
    for (pEVar25 = ((local_168.obj_)->desc_).events.
                   super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1b8.obj_ = pIVar16,
        local_198 = pPVar31, pEVar25 != pEVar8; pEVar25 = (pointer)((long)pEVar25 + 0x28)) {
      local_110.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_001a02d0;
      local_110.super_ExternType._8_8_ =
           (((EventType *)((long)pEVar25 + 8))->super_ExternType)._vptr_ExternType;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_110.signature,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)pEVar25 + 0x10));
      Store::Alloc<wabt::interp::Event,wabt::interp::Store&,wabt::interp::EventType&>
                ((RefPtr<wabt::interp::Event> *)local_1f8,store,store,&local_110);
      pRVar19 = (Ref *)&Ref::Null;
      if ((Store *)local_1f8._8_8_ != (Store *)0x0) {
        pRVar19 = FreeList<wabt::interp::Ref>::Get
                            ((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
      }
      local_1d8.i64_ = pRVar19->index;
      iVar32._M_current =
           *(Ref **)&((RefVec *)((long)pIVar16 + 200))->
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>;
      if (iVar32._M_current ==
          *(Ref **)&((RefVec *)((long)pIVar16 + 0xd0))->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>
                  ((RefVec *)((long)pIVar16 + 0xc0),iVar32,&local_1d8.ref_);
      }
      else {
        (iVar32._M_current)->index = pRVar19->index;
        *(Ref **)&((RefVec *)((long)pIVar16 + 200))->
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> =
             iVar32._M_current + 1;
      }
      if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
        FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_);
        local_1f8._0_8_ = (Func *)0x0;
        local_1f8._8_8_ = (Store *)0x0;
        local_1f8._16_8_ = 0;
      }
      local_110.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_001a02d0;
      if (local_110.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.signature.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar16 = local_1b8.obj_;
      pPVar31 = local_198;
    }
    pEVar39 = *(pointer *)&((ModuleDesc *)((long)local_168.obj_ + 0xe8))->func_types;
    pEVar9 = *(pointer *)&((ModuleDesc *)((long)local_168.obj_ + 0xf0))->func_types;
    if (pEVar39 != pEVar9) {
      do {
        pFVar20 = (Func *)(pEVar39->type).type._M_t.
                          super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                          .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
        switch(*(ObjectKind *)((long)&pFVar20->super_Extern + 8)) {
        case Null:
          uVar34 = (ulong)pEVar39->index;
          pRVar23 = ((local_1b8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Foreign:
          uVar34 = (ulong)pEVar39->index;
          pRVar23 = ((local_1b8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case Trap:
          uVar34 = (ulong)pEVar39->index;
          pRVar23 = ((local_1b8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case DefinedFunc:
          uVar34 = (ulong)pEVar39->index;
          pRVar23 = ((local_1b8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case HostFunc:
          uVar34 = (ulong)pEVar39->index;
          pRVar23 = ((local_1b8.obj_)->events_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_0015266a_default;
        }
        pFVar20 = (Func *)pRVar23[uVar34].index;
        local_1f8._0_8_ = pFVar20;
switchD_0015266a_default:
        iVar32._M_current =
             ((local_1b8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar32._M_current ==
            ((local_1b8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1b8.obj_)->exports_,iVar32,(Ref *)local_1f8);
        }
        else {
          (iVar32._M_current)->index = (size_t)pFVar20;
          ((local_1b8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar32._M_current + 1;
        }
        pEVar39 = pEVar39 + 1;
      } while (pEVar39 != pEVar9);
    }
    pFVar20 = (Func *)((local_168.obj_)->desc_).elems.
                      super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pFVar10 = (Func *)((local_168.obj_)->desc_).elems.
                      super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar20 != pFVar10) {
      do {
        local_1f8._0_8_ = pFVar20;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_1b8.obj_)->elems_,(ElemDesc **)local_1f8,&local_1b8);
        pFVar20 = (Func *)&pFVar20->type_;
        pPVar31 = local_198;
      } while (pFVar20 != pFVar10);
    }
    pFVar20 = (Func *)((local_168.obj_)->desc_).datas.
                      super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    pFVar10 = (Func *)((local_168.obj_)->desc_).datas.
                      super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    pMVar21 = local_168.obj_;
    if (pFVar20 != pFVar10) {
      do {
        local_1f8._0_8_ = pFVar20;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_1b8.obj_)->datas_,(DataDesc **)local_1f8);
        pFVar20 = (Func *)&(pFVar20->super_Extern).super_Object.self_;
        pMVar21 = extraout_RAX;
      } while (pFVar20 != pFVar10);
    }
    local_190 = (RefVec *)
                CONCAT44(local_190._4_4_,
                         (int)CONCAT71((int7)((ulong)pMVar21 >> 8),
                                       (store->features_).bulk_memory_enabled_ == false));
    local_150 = store;
    do {
      pEVar11 = ((local_1b8.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_1b8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar11; src = src + 1) {
        pEVar12 = src->desc_;
        if (pEVar12->mode == Declared) {
          pRVar23 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar23) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar23;
          }
        }
        else if (pEVar12->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_1d8.v128_,store,
                     (Ref)((local_1b8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar12->table_index].index);
          store_00 = store;
          VVar41 = ResolveInitExpr(local_1b8.obj_,store,pEVar12->offset);
          uVar34 = VVar41.i64_;
          pRVar23 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar24 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar35 = (ulong)((long)pRVar24 - (long)pRVar23) >> 3;
          if (((ulong)local_190 & 1) == 0) {
            RVar18 = Table::Init((Table *)local_1d8.i64_,store_00,VVar41.i32_,src,0,(u32)uVar35);
            pRVar23 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pRVar24 = pRVar23;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar23) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar23;
            }
          }
          else {
            uVar22 = (long)*(pointer *)(local_1d8.i64_ + 0x70) -
                     (long)(((RefVec *)(local_1d8.i64_ + 0x68))->
                           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3;
            uVar35 = uVar35 & 0xffffffff;
            RVar18.enum_ = (Enum)(uVar22 - uVar35 < (uVar34 & 0xffffffff) || uVar22 < uVar35);
          }
          if (RVar18.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar34 & 0xffffffff,
                       ((ulong)((long)pRVar24 - (long)pRVar23) >> 3 & 0xffffffff) +
                       (uVar34 & 0xffffffff),
                       (ulong)(*(long *)(local_1d8.i64_ + 0x70) - *(long *)(local_1d8.i64_ + 0x68))
                       >> 3);
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            Store::
            Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                      (&local_148,store,store,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_188);
            pPVar31->obj_ = local_148.obj_;
            pPVar31->store_ = local_148.store_;
            pPVar31->root_index_ = local_148.root_index_;
            goto LAB_00152c83;
          }
          if (local_1d8.i64_ != 0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1d8._8_8_ + 0x68),local_1c8);
          }
        }
      }
      pDVar13 = ((local_1b8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar40 = ((local_1b8.obj_)->datas_).
                     super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar40 != pDVar13;
          pDVar40 = pDVar40 + 1) {
        pDVar14 = pDVar40->desc_;
        if (pDVar14->mode != Declared) {
          if (pDVar14->mode != Active) goto LAB_001529ba;
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_1d8.v128_,store,
                     (Ref)((local_1b8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar14->memory_index].index);
          VVar41 = ResolveInitExpr(local_1b8.obj_,store,pDVar14->offset);
          uVar35 = VVar41.i64_;
          uVar22 = (ulong)pDVar40->size_;
          uVar34 = (uVar35 & 0xffffffff) + uVar22;
          uVar30 = *(long *)(local_1d8.i64_ + 0x70) - *(long *)(local_1d8.i64_ + 0x68);
          if (((ulong)local_190 & 1) == 0) {
            if ((uVar22 != 0) && (uVar34 <= uVar30)) {
              memmove((void *)(*(long *)(local_1d8.i64_ + 0x68) + (uVar35 & 0xffffffff)),
                      (pDVar40->desc_->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar22);
            }
            pDVar40->size_ = 0;
            if (uVar34 <= uVar30) goto LAB_0015298c;
            uVar22 = 0;
          }
          else if (uVar34 <= uVar30) {
LAB_0015298c:
            pPVar31 = local_198;
            store = local_150;
            if (local_1d8.i64_ != 0) {
              FreeList<wabt::interp::Ref>::Delete
                        ((FreeList<wabt::interp::Ref> *)(local_1d8._8_8_ + 0x68),local_1c8);
              store = local_150;
            }
            goto LAB_001529ba;
          }
          pPVar31 = local_198;
          StringPrintf_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %u"
                     ,uVar35 & 0xffffffff,(uVar35 & 0xffffffff) + uVar22,
                     (ulong)(uint)(*(int *)(local_1d8.i64_ + 0x70) - *(int *)(local_1d8.i64_ + 0x68)
                                  ));
          local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    (&local_148,local_150,local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_188);
          pPVar31->obj_ = local_148.obj_;
          pPVar31->store_ = local_148.store_;
          pPVar31->root_index_ = local_148.root_index_;
LAB_00152c83:
          local_148.root_index_ = 0;
          local_148.store_ = (Store *)0x0;
          local_148.obj_ = (Trap *)0x0;
          if (local_188.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((Func *)local_1f8._0_8_ != (Func *)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_);
          }
          local_1a0->obj_ = (Instance *)0x0;
          local_1a0->store_ = (Store *)0x0;
          local_1a0->root_index_ = 0;
          if (local_1d8.i64_ != 0) {
            index = local_1c8;
            uVar33 = local_1d8._8_8_;
            goto LAB_00152cc5;
          }
          goto LAB_00152cce;
        }
        pDVar40->size_ = 0;
LAB_001529ba:
      }
      uVar34 = (ulong)local_190 & 1;
      local_190 = (RefVec *)((ulong)local_190 & 0xffffffff00000000);
    } while (uVar34 != 0);
    pSVar38 = ((local_168.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar15 = ((local_168.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar38 != pSVar15) {
      do {
        RefPtr<wabt::interp::Func>::RefPtr
                  ((RefPtr<wabt::interp::Func> *)local_1f8,store,
                   (Ref)((local_1b8.obj_)->funcs_).
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start[pSVar38->func_index].index);
        local_1c8 = 0;
        local_1d8 = (Value)ZEXT816(0);
        local_148.root_index_ = 0;
        local_148.obj_ = (Trap *)0x0;
        local_148.store_ = (Store *)0x0;
        RVar18 = Func::Call((Func *)local_1f8._0_8_,store,(Values *)&local_148,
                            (Values *)&local_1d8.v128_,pPVar31,(Stream *)0x0);
        if (local_148.obj_ != (Trap *)0x0) {
          operator_delete(local_148.obj_);
        }
        if (RVar18.enum_ == Error) {
          local_1a0->obj_ = (Instance *)0x0;
          local_1a0->store_ = (Store *)0x0;
          local_1a0->root_index_ = 0;
          if ((void *)local_1d8.i64_ != (void *)0x0) {
            operator_delete((void *)local_1d8.i64_);
          }
          index = local_1f8._16_8_;
          uVar33 = local_1f8._8_8_;
          if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
LAB_00152cc5:
            FreeList<wabt::interp::Ref>::Delete(&((Store *)uVar33)->roots_,index);
          }
          goto LAB_00152cce;
        }
        if ((void *)local_1d8.i64_ != (void *)0x0) {
          operator_delete((void *)local_1d8.i64_);
        }
        pPVar31 = local_198;
        if ((Func *)local_1f8._0_8_ != (Func *)0x0) {
          FreeList<wabt::interp::Ref>::Delete((RootList *)(local_1f8._8_8_ + 0x68),local_1f8._16_8_)
          ;
        }
        pSVar38 = pSVar38 + 1;
      } while (pSVar38 != pSVar15);
    }
    local_1a0->obj_ = local_1b8.obj_;
    local_1a0->store_ = local_1b8.store_;
    local_1a0->root_index_ = local_1b8.root_index_;
  }
  if (local_168.obj_ != (Module *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_168.store_)->roots_,local_168.root_index_);
  }
  return local_1a0;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                           offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}